

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O1

bool tcu::isFixedPointDepthTextureFormat(TextureFormat *format)

{
  TextureChannelClass TVar1;
  byte bVar2;
  
  TVar1 = getTextureChannelClass(format->type);
  if (format->order == DS) {
    bVar2 = 1;
    if (format->type < CHANNELTYPE_LAST) {
      bVar2 = (byte)(0x1fffffffff >> ((byte)format->type & 0x3f));
    }
  }
  else if (format->order == D) {
    bVar2 = TVar1 != TEXTURECHANNELCLASS_FLOATING_POINT;
  }
  else {
    bVar2 = 0;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

static bool isFixedPointDepthTextureFormat (const tcu::TextureFormat& format)
{
	const tcu::TextureChannelClass channelClass = tcu::getTextureChannelClass(format.type);

	if (format.order == TextureFormat::D)
	{
		// depth internal formats cannot be non-normalized integers
		return channelClass != tcu::TEXTURECHANNELCLASS_FLOATING_POINT;
	}
	else if (format.order == TextureFormat::DS)
	{
		// combined formats have no single channel class, detect format manually
		switch (format.type)
		{
			case tcu::TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:	return false;
			case tcu::TextureFormat::UNSIGNED_INT_16_8_8:			return true;
			case tcu::TextureFormat::UNSIGNED_INT_24_8:				return true;
			case tcu::TextureFormat::UNSIGNED_INT_24_8_REV:			return true;

			default:
			{
				// unknown format
				DE_ASSERT(false);
				return true;
			}
		}
	}

	return false;
}